

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

void __thiscall
soul::HEARTGenerator::generateFunctions
          (HEARTGenerator *this,ArrayView<soul::pool_ref<soul::AST::Function>_> functions)

{
  Function *f;
  pool_ref<soul::AST::Function> *__end2;
  pool_ref<soul::AST::Function> *ppVar1;
  pool_ref<soul::AST::Function> *__begin2;
  
  for (ppVar1 = functions.s; ppVar1 != functions.e; ppVar1 = ppVar1 + 1) {
    f = ppVar1->object;
    if ((f->genericWildcards).
        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (f->genericWildcards).
        super__Vector_base<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      generateFunction(this,f);
    }
  }
  return;
}

Assistant:

void generateFunctions (ArrayView<pool_ref<AST::Function>> functions)
    {
        for (auto& f : functions)
            if (! f->isGeneric())
                generateFunction (f);
    }